

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O2

void mutex_cv_ping_pong(ping_pong *pp,int parity)

{
  nsync_pthread_mutex_ *pcv;
  undefined1 auVar1 [16];
  uint uVar2;
  ulong in_stack_ffffffffffffffc0;
  
  pcv = &pp->mutex;
  nsync_pthread_mutex_lock_(pcv);
  while (uVar2 = pp->i, (int)uVar2 < pp->limit) {
    while ((uVar2 & 1) == parity) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_stack_ffffffffffffffc0;
      nsync::nsync_cv_wait_with_deadline_generic
                ((nsync *)(pp->cv + (uint)parity),(nsync_cv *)pcv,void_pthread_mutex_lock,
                 void_pthread_mutex_unlock,(_func_void_void_ptr *)0x7fffffffffffffff,
                 (nsync_time)(auVar1 << 0x40),(nsync_note)0x3b9ac9ff);
      uVar2 = pp->i;
    }
    pp->i = uVar2 + 1;
    nsync::nsync_cv_signal(pp->cv + (1 - parity));
  }
  nsync_pthread_mutex_unlock_(pcv);
  ping_pong_done(pp);
  return;
}

Assistant:

static void mutex_cv_ping_pong (ping_pong *pp, int parity) {
	pthread_mutex_lock (&pp->mutex);
	while (pp->i < pp->limit) {
		while ((pp->i & 1) == parity) {
			nsync_cv_wait_with_deadline_generic (&pp->cv[parity], &pp->mutex,
						             &void_pthread_mutex_lock,
						             &void_pthread_mutex_unlock,
						             nsync_time_no_deadline, NULL);
		}
		pp->i++;
		nsync_cv_signal (&pp->cv[1-parity]);
	}

	pthread_mutex_unlock (&pp->mutex);
	ping_pong_done (pp);
}